

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertLine
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,LineGeometry *line,Model *model,aiNode *parent,aiNode *root_node)

{
  pointer __src;
  pointer piVar1;
  pointer piVar2;
  uint *puVar3;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  aiMesh *paVar6;
  aiVector3D *__s;
  ulong *puVar7;
  aiFace *paVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  size_t __n;
  int iVar12;
  ulong uVar13;
  aiFace *paVar14;
  int iVar15;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = LineGeometry::GetVertices(line);
  pvVar5 = LineGeometry::GetIndices(line);
  if (((pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
       super__Vector_impl_data._M_start ==
       (pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::operator+(&local_1c8,"ignoring empty line: ",&(line->super_Geometry).super_Object.name);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &local_1c8);
    LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    paVar6 = SetupEmptyMesh(this,&line->super_Geometry,root_node);
    *(byte *)&paVar6->mPrimitiveTypes = (byte)paVar6->mPrimitiveTypes | 2;
    uVar10 = (int)((long)(pvVar4->
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar4->
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x55555555;
    paVar6->mNumVertices = uVar10;
    uVar16 = (ulong)uVar10 * 0xc;
    __s = (aiVector3D *)operator_new__(uVar16);
    if ((ulong)uVar10 != 0) {
      memset(__s,0,((uVar16 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar6->mVertices = __s;
    __src = (pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(__s,__src,__n);
    }
    piVar1 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar2 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    uVar16 = (long)piVar2 - (long)piVar1 >> 2;
    if (piVar2 == piVar1) {
      iVar12 = 0;
    }
    else {
      uVar11 = 0;
      iVar12 = 0;
      do {
        iVar12 = iVar12 - (piVar1[uVar11] >> 0x1f);
        uVar11 = uVar11 + 1;
      } while ((uVar11 & 0xffffffff) < uVar16);
    }
    iVar15 = (int)uVar16;
    uVar11 = (ulong)(uint)(iVar15 - iVar12);
    paVar6->mNumFaces = iVar15 - iVar12;
    puVar7 = (ulong *)operator_new__(uVar11 * 0x10 + 8);
    *puVar7 = uVar11;
    paVar14 = (aiFace *)(puVar7 + 1);
    if (iVar15 != iVar12) {
      paVar8 = paVar14;
      do {
        paVar8->mNumIndices = 0;
        paVar8->mIndices = (uint *)0x0;
        paVar8 = paVar8 + 1;
      } while (paVar8 != paVar14 + uVar11);
    }
    paVar6->mFaces = paVar14;
    if (iVar15 != 0) {
      uVar11 = 0;
      do {
        if (-1 < (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11]) {
          paVar14->mNumIndices = 2;
          puVar9 = (uint *)operator_new__(8);
          paVar14->mIndices = puVar9;
          puVar3 = paVar14->mIndices;
          paVar14 = paVar14 + 1;
          piVar1 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar9 = piVar1[uVar11];
          uVar13 = 0;
          if (uVar11 + 1 != (uVar16 & 0xffffffff)) {
            uVar13 = uVar11 + 1 & 0xffffffff;
          }
          uVar10 = piVar1[uVar13];
          puVar3[1] = (int)uVar10 >> 0x1f ^ uVar10;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar16 & 0xffffffff));
    }
    local_1a8._0_4_ =
         (int)((ulong)((long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (__return_storage_ptr__,(uint *)local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertLine(const LineGeometry& line, const Model& model,
                                                            aiNode *parent, aiNode *root_node)
        {
            std::vector<unsigned int> temp;

            const std::vector<aiVector3D>& vertices = line.GetVertices();
            const std::vector<int>& indices = line.GetIndices();
            if (vertices.empty() || indices.empty()) {
                FBXImporter::LogWarn("ignoring empty line: " + line.Name());
                return temp;
            }

            aiMesh* const out_mesh = SetupEmptyMesh(line, root_node);
            out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[out_mesh->mNumVertices];
            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            //Number of line segments (faces) is "Number of Points - Number of Endpoints"
            //N.B.: Endpoints in FbxLine are denoted by negative indices.
            //If such an Index is encountered, add 1 and multiply by -1 to get the real index.
            unsigned int epcount = 0;
            for (unsigned i = 0; i < indices.size(); i++)
            {
                if (indices[i] < 0) {
                    epcount++;
                }
            }
            unsigned int pcount = static_cast<unsigned int>( indices.size() );
            unsigned int scount = out_mesh->mNumFaces = pcount - epcount;

            aiFace* fac = out_mesh->mFaces = new aiFace[scount]();
            for (unsigned int i = 0; i < pcount; ++i) {
                if (indices[i] < 0) continue;
                aiFace& f = *fac++;
                f.mNumIndices = 2; //2 == aiPrimitiveType_LINE 
                f.mIndices = new unsigned int[2];
                f.mIndices[0] = indices[i];
                int segid = indices[(i + 1 == pcount ? 0 : i + 1)];   //If we have reached he last point, wrap around
                f.mIndices[1] = (segid < 0 ? (segid + 1)*-1 : segid); //Convert EndPoint Index to normal Index
            }
            temp.push_back(static_cast<unsigned int>(meshes.size() - 1));
            return temp;
        }